

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.h
# Opt level: O0

_Bool arm_el_is_aa64(CPUARMState_conflict *env,int el)

{
  _Bool _Var1;
  int iVar2;
  bool bVar3;
  _Bool aa64;
  int el_local;
  CPUARMState_conflict *env_local;
  
  if ((0 < el) && (el < 4)) {
    iVar2 = arm_feature(env,0x1c);
    env_local._7_1_ = iVar2 != 0;
    if (el != 3) {
      iVar2 = arm_feature(env,0x21);
      bVar3 = env_local._7_1_;
      if ((iVar2 != 0) && (bVar3 = false, env_local._7_1_)) {
        bVar3 = ((env->cp15).scr_el3 & 0x400) != 0;
      }
      env_local._7_1_ = bVar3;
      if ((((el != 2) && (iVar2 = arm_feature(env,0x20), iVar2 != 0)) &&
          (_Var1 = arm_is_secure_below_el3(env), !_Var1)) &&
         (bVar3 = env_local._7_1_ != false, env_local._7_1_ = false, bVar3)) {
        env_local._7_1_ = ((env->cp15).hcr_el2 & 0x80000000) != 0;
      }
    }
    return env_local._7_1_;
  }
  __assert_fail("el >= 1 && el <= 3",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/cpu.h"
                ,0x7f3,"_Bool arm_el_is_aa64(CPUARMState *, int)");
}

Assistant:

static inline bool arm_el_is_aa64(CPUARMState *env, int el)
{
    /* This isn't valid for EL0 (if we're in EL0, is_a64() is what you want,
     * and if we're not in EL0 then the state of EL0 isn't well defined.)
     */
    assert(el >= 1 && el <= 3);
    bool aa64 = arm_feature(env, ARM_FEATURE_AARCH64);

    /* The highest exception level is always at the maximum supported
     * register width, and then lower levels have a register width controlled
     * by bits in the SCR or HCR registers.
     */
    if (el == 3) {
        return aa64;
    }

    if (arm_feature(env, ARM_FEATURE_EL3)) {
        aa64 = aa64 && (env->cp15.scr_el3 & SCR_RW);
    }

    if (el == 2) {
        return aa64;
    }

    if (arm_feature(env, ARM_FEATURE_EL2) && !arm_is_secure_below_el3(env)) {
        aa64 = aa64 && (env->cp15.hcr_el2 & HCR_RW);
    }

    return aa64;
}